

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O2

shared_ptr<LNode> __thiscall LParser::reduce_4(LParser *this)

{
  shared_ptr<LNode> sVar1;
  
  sVar1 = std::make_shared<LNode,LNodeType>((LNodeType *)this);
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_4() {
    // BStmt : BREAK BR Brs
    return std::make_shared<LNode>(LNodeType::BStmt);
}